

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::AddColumnInfo,duckdb::AlterEntryData,duckdb::ColumnDefinition,bool_const&>
          (duckdb *this,AlterEntryData *args,ColumnDefinition *args_1,bool *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  AddColumnInfo *this_00;
  AlterEntryData local_170;
  undefined1 local_108 [216];
  
  this_00 = (AddColumnInfo *)operator_new(0x158);
  local_170.catalog._M_dataplus._M_p = (pointer)&local_170.catalog.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->catalog)._M_dataplus._M_p;
  paVar1 = &(args->catalog).field_2;
  if (paVar2 == paVar1) {
    local_170.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_170.catalog.field_2._8_8_ = *(undefined8 *)((long)&(args->catalog).field_2 + 8);
  }
  else {
    local_170.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_170.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  local_170.catalog._M_string_length = (args->catalog)._M_string_length;
  local_170.schema._M_dataplus._M_p = (pointer)&local_170.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->schema)._M_dataplus._M_p;
  paVar1 = &(args->schema).field_2;
  if (paVar2 == paVar1) {
    local_170.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_170.schema.field_2._8_8_ = *(undefined8 *)((long)&(args->schema).field_2 + 8);
  }
  else {
    local_170.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_170.schema._M_dataplus._M_p = (pointer)paVar2;
  }
  local_170.schema._M_string_length = (args->schema)._M_string_length;
  local_170.name._M_dataplus._M_p = (pointer)&local_170.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar1;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->name)._M_dataplus._M_p;
  paVar1 = &(args->name).field_2;
  if (paVar2 == paVar1) {
    local_170.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_170.name.field_2._8_8_ = *(undefined8 *)((long)&(args->name).field_2 + 8);
  }
  else {
    local_170.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_170.name._M_dataplus._M_p = (pointer)paVar2;
  }
  local_170.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar1;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_170.if_not_found = args->if_not_found;
  local_108._0_8_ = local_108 + 0x10;
  pcVar3 = (args_1->name)._M_dataplus._M_p;
  paVar1 = &(args_1->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    local_108._16_8_ = paVar1->_M_allocated_capacity;
    local_108._24_8_ = *(undefined8 *)((long)&(args_1->name).field_2 + 8);
  }
  else {
    local_108._16_8_ = paVar1->_M_allocated_capacity;
    local_108._0_8_ = pcVar3;
  }
  local_108._8_8_ = (args_1->name)._M_string_length;
  (args_1->name)._M_dataplus._M_p = (pointer)paVar1;
  (args_1->name)._M_string_length = 0;
  (args_1->name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType((LogicalType *)(local_108 + 0x20),&args_1->type);
  local_108[0x38] = args_1->compression_type;
  local_108._57_7_ = *(undefined7 *)&args_1->field_0x39;
  local_108._73_8_ = *(undefined8 *)((long)&args_1->oid + 1);
  local_108[0x48] = (undefined1)((ulong)*(undefined8 *)((long)&args_1->storage_oid + 1) >> 0x38);
  local_108[0x40] = (undefined1)args_1->storage_oid;
  local_108._65_7_ = (undefined7)(args_1->storage_oid >> 8);
  local_108._88_8_ =
       (args_1->expression).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (args_1->expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  Value::Value((Value *)(local_108 + 0x60),&args_1->comment);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_108 + 0xa0),&args_1->tags);
  AddColumnInfo::AddColumnInfo(this_00,&local_170,(ColumnDefinition *)local_108,*args_2);
  *(AddColumnInfo **)this = this_00;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_108 + 0xa0));
  Value::~Value((Value *)(local_108 + 0x60));
  if ((ParsedExpression *)local_108._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_108._88_8_ + 8))();
  }
  local_108._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.name._M_dataplus._M_p != &local_170.name.field_2) {
    operator_delete(local_170.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.schema._M_dataplus._M_p != &local_170.schema.field_2) {
    operator_delete(local_170.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.catalog._M_dataplus._M_p != &local_170.catalog.field_2) {
    operator_delete(local_170.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}